

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::detail::report_error(format_func func,int error_code,string_view message)

{
  char *__ptr;
  size_t __size;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  code *in_RDI;
  memory_buffer full_message;
  allocator<char> *in_stack_fffffffffffffd88;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  allocator<char> local_239;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_238;
  undefined4 local_1c;
  code *local_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_1c = in_ESI;
  local_18 = in_RDI;
  local_10 = in_RDX;
  uStack_8 = in_RCX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_239);
  (*local_18)(&local_238,local_1c,local_10,uStack_8);
  this = &local_238;
  __ptr = buffer<char>::data(&this->super_buffer<char>);
  __size = buffer<char>::size(&this->super_buffer<char>);
  fwrite(__ptr,__size,1,_stderr);
  fputc(10,_stderr);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           string_view message) FMT_NOEXCEPT {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_fully because the latter may throw.
  (void)std::fwrite(full_message.data(), full_message.size(), 1, stderr);
  std::fputc('\n', stderr);
}